

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

void crnlib::MatchFinder_CheckLimits(CMatchFinder *p)

{
  CLzRef *pCVar1;
  uint uVar2;
  UInt32 lenLimit;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  CLzRef CVar8;
  
  if (p->pos == 0xffffffff) {
    uVar2 = -p->historySize - 2 & 0xfffffc00;
    uVar3 = p->numSons + p->hashSizeSum;
    if (uVar3 != 0) {
      pCVar1 = p->hash;
      uVar7 = 0;
      do {
        uVar5 = pCVar1[uVar7];
        CVar8 = uVar5 - uVar2;
        if (uVar5 < uVar2) {
          CVar8 = 0;
        }
        pCVar1[uVar7] = CVar8;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    p->posLimit = p->posLimit - uVar2;
    p->pos = p->pos - uVar2;
    p->streamPos = p->streamPos - uVar2;
  }
  if (p->streamEndWasReached == 0) {
    uVar2 = p->streamPos - p->pos;
    if (p->keepSizeAfter == uVar2) {
      if (p->bufferBase + ((ulong)p->blockSize - (long)p->buffer) <= (Byte *)(ulong)p->keepSizeAfter
         ) {
        memmove(p->bufferBase,p->buffer + -(ulong)p->keepSizeBefore,
                (ulong)(uVar2 + p->keepSizeBefore));
        p->buffer = p->bufferBase + p->keepSizeBefore;
      }
      MatchFinder_ReadBlock(p);
    }
  }
  if (p->cyclicBufferPos == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
  }
  uVar2 = p->pos;
  uVar3 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (~uVar2 <= uVar3) {
    uVar3 = ~uVar2;
  }
  uVar4 = p->streamPos - uVar2;
  uVar6 = uVar4 - p->keepSizeAfter;
  uVar5 = (uint)(uVar4 != 0);
  if (p->keepSizeAfter <= uVar4 && uVar6 != 0) {
    uVar5 = uVar6;
  }
  if (uVar3 <= uVar5) {
    uVar5 = uVar3;
  }
  if (p->matchMaxLen <= uVar4) {
    uVar4 = p->matchMaxLen;
  }
  p->lenLimit = uVar4;
  p->posLimit = uVar5 + uVar2;
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder* p) {
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}